

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_output_stores_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::EliminateDeadOutputStoresPass::AnyLocsAreLive
          (EliminateDeadOutputStoresPass *this,uint32_t start,uint32_t count)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  __node_base_ptr p_Var3;
  __node_base_ptr p_Var4;
  uint uVar5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar5 = count + start;
  bVar10 = start < uVar5;
  if (start < uVar5) {
    uVar1 = (this->live_locs_->_M_h)._M_bucket_count;
    uVar8 = (ulong)start;
    do {
      uVar6 = uVar8 % uVar1;
      p_Var3 = (this->live_locs_->_M_h)._M_buckets[uVar6];
      p_Var4 = (__node_base_ptr)0x0;
      if (p_Var3 != (__node_base_ptr)0x0) {
        uVar9 = (ulong)*(uint *)&p_Var3->_M_nxt[1]._M_nxt;
        p_Var7 = p_Var3->_M_nxt;
        do {
          p_Var4 = p_Var3;
          if (uVar8 == uVar9) break;
          p_Var2 = p_Var7->_M_nxt;
          if (p_Var2 == (_Hash_node_base *)0x0) {
            p_Var4 = (__node_base_ptr)0x0;
            break;
          }
          uVar9 = (ulong)*(uint *)&p_Var2[1]._M_nxt;
          p_Var4 = (__node_base_ptr)0x0;
          p_Var3 = p_Var7;
          p_Var7 = p_Var2;
        } while (uVar9 % uVar1 == uVar6);
      }
      if ((p_Var4 != (__node_base_ptr)0x0) && (p_Var4->_M_nxt != (_Hash_node_base *)0x0)) {
        return bVar10;
      }
      uVar8 = uVar8 + 1;
      bVar10 = uVar8 < uVar5;
    } while (uVar8 != uVar5);
  }
  return bVar10;
}

Assistant:

bool EliminateDeadOutputStoresPass::AnyLocsAreLive(uint32_t start,
                                                   uint32_t count) {
  auto finish = start + count;
  for (uint32_t u = start; u < finish; ++u) {
    if (live_locs_->find(u) != live_locs_->end()) return true;
  }
  return false;
}